

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRProjectionNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRProjectionNode::VRProjectionNode
          (VRProjectionNode *this,string *name,float fovX,float fovY,float nearClip,float farClip)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  float fVar1;
  allocator<char> local_91;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  VRMatrix4 projMat;
  string local_38;
  
  local_90 = fovX;
  local_8c = fovY;
  local_88 = nearClip;
  local_84 = farClip;
  VRDisplayNode::VRDisplayNode(&this->super_VRDisplayNode,name);
  (this->super_VRDisplayNode)._vptr_VRDisplayNode = (_func_int **)&PTR__VRProjectionNode_0015d888;
  this->_fovX = local_90;
  this->_fovY = local_8c;
  this->_nearClip = local_88;
  this->_farClip = local_84;
  VRMatrix4::VRMatrix4(&this->_projectionMatrix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CameraMatrix",(allocator<char> *)&projMat);
  VRDisplayNode::_addValueNeeded(&this->super_VRDisplayNode,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&projMat,"ViewMatrix",&local_91);
  this_00 = &(this->super_VRDisplayNode)._valuesAdded;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)&projMat);
  std::__cxx11::string::~string((string *)&projMat);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&projMat,"ProjectionMatrix",&local_91);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)&projMat);
  std::__cxx11::string::~string((string *)&projMat);
  fVar1 = tanf(local_90 * 0.017453292 * 0.5);
  this->_horizontalClip = fVar1 * this->_nearClip;
  fVar1 = tanf(local_8c * 0.017453292 * 0.5);
  fVar1 = fVar1 * this->_nearClip;
  this->_verticalClip = fVar1;
  VRMatrix4::projection
            (&projMat,-this->_horizontalClip,this->_horizontalClip,-fVar1,fVar1,this->_nearClip,
             this->_farClip);
  VRMatrix4::operator=(&this->_projectionMatrix,&projMat);
  VRMatrix4::~VRMatrix4(&projMat);
  return;
}

Assistant:

VRProjectionNode::VRProjectionNode(const std::string &name, float fovX, float fovY, float nearClip, float farClip):
  VRDisplayNode(name), _fovX(fovX), _fovY(fovY), _nearClip(nearClip), _farClip(farClip)
{
  // in:
  _addValueNeeded("CameraMatrix");
  // These should be recorded as necessary, and the auditValues()
  // method needs to be changed to accommodate not just the values
  // added by nodes in teh display tree, but also from the config
  // files.
  //_addValueNeeded("NearClip");
  // _addValueNeeded("FarClip");
  // _addValueNeeded("FieldOfViewY");
  // _addValueNeeded("FieldOfViewX");

  // out:
  _valuesAdded.push_back("ViewMatrix");
  _valuesAdded.push_back("ProjectionMatrix");

  float degreeToRadian = 3.1415926f / 180;
  _horizontalClip = tan(fovX * degreeToRadian / 2.0f) * _nearClip;
  _verticalClip = tan(fovY * degreeToRadian / 2.0f) * _nearClip;

  VRMatrix4 projMat = VRMatrix4::projection(-_horizontalClip, _horizontalClip, -_verticalClip, _verticalClip, _nearClip, _farClip); //TODO: This should just be cacheable once since it doesn't change.
 _projectionMatrix = projMat;


}